

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  probe_seq<16UL> seq;
  __m128i match;
  probe_seq<16UL> local_60;
  undefined1 local_48 [16];
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    bVar5 = false;
  }
  else {
    probe(&local_60,this,hashval);
    auVar6 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar6 = pshuflw(auVar6,auVar6,0);
    local_48._0_4_ = auVar6._0_4_;
    local_48._4_4_ = local_48._0_4_;
    local_48._8_4_ = local_48._0_4_;
    local_48._12_4_ = local_48._0_4_;
    while( true ) {
      pcVar1 = this->ctrl_ + local_60.offset_;
      local_38 = *pcVar1;
      cStack_37 = pcVar1[1];
      cStack_36 = pcVar1[2];
      cStack_35 = pcVar1[3];
      cStack_34 = pcVar1[4];
      cStack_33 = pcVar1[5];
      cStack_32 = pcVar1[6];
      cStack_31 = pcVar1[7];
      cStack_30 = pcVar1[8];
      cStack_2f = pcVar1[9];
      cStack_2e = pcVar1[10];
      cStack_2d = pcVar1[0xb];
      cStack_2c = pcVar1[0xc];
      cStack_2b = pcVar1[0xd];
      cStack_2a = pcVar1[0xe];
      cStack_29 = pcVar1[0xf];
      auVar6[0] = -(local_48[0] == local_38);
      auVar6[1] = -(local_48[1] == cStack_37);
      auVar6[2] = -(local_48[2] == cStack_36);
      auVar6[3] = -(local_48[3] == cStack_35);
      auVar6[4] = -(local_48[4] == cStack_34);
      auVar6[5] = -(local_48[5] == cStack_33);
      auVar6[6] = -(local_48[6] == cStack_32);
      auVar6[7] = -(local_48[7] == cStack_31);
      auVar6[8] = -(local_48[8] == cStack_30);
      auVar6[9] = -(local_48[9] == cStack_2f);
      auVar6[10] = -(local_48[10] == cStack_2e);
      auVar6[0xb] = -(local_48[0xb] == cStack_2d);
      auVar6[0xc] = -(local_48[0xc] == cStack_2c);
      auVar6[0xd] = -(local_48[0xd] == cStack_2b);
      auVar6[0xe] = -(local_48[0xe] == cStack_2a);
      auVar6[0xf] = -(local_48[0xf] == cStack_29);
      for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar6[0xf] >> 7) << 0xf); bVar5 = uVar4 != 0, bVar5;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        bVar3 = std::operator==(&this->slots_[uVar2 + local_60.offset_ & local_60.mask_].value,elem)
        ;
        if (bVar3) {
          return bVar5;
        }
      }
      auVar7[0] = -(local_38 == -0x80);
      auVar7[1] = -(cStack_37 == -0x80);
      auVar7[2] = -(cStack_36 == -0x80);
      auVar7[3] = -(cStack_35 == -0x80);
      auVar7[4] = -(cStack_34 == -0x80);
      auVar7[5] = -(cStack_33 == -0x80);
      auVar7[6] = -(cStack_32 == -0x80);
      auVar7[7] = -(cStack_31 == -0x80);
      auVar7[8] = -(cStack_30 == -0x80);
      auVar7[9] = -(cStack_2f == -0x80);
      auVar7[10] = -(cStack_2e == -0x80);
      auVar7[0xb] = -(cStack_2d == -0x80);
      auVar7[0xc] = -(cStack_2c == -0x80);
      auVar7[0xd] = -(cStack_2b == -0x80);
      auVar7[0xe] = -(cStack_2a == -0x80);
      auVar7[0xf] = -(cStack_29 == -0x80);
      if ((((((((((((((((auVar7 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar7 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar7 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar7 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar7 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar7 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar7 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar7 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar7 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar7 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar7 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar7 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_29 == -0x80)
      break;
      local_60.index_ = local_60.index_ + 0x10;
      local_60.offset_ = local_60.offset_ + local_60.index_ & local_60.mask_;
      if (this->capacity_ <= local_60.index_) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>]"
                     );
      }
    }
  }
  return bVar5;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }